

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_Io * handleIo_duplicate(PHYSFS_Io *io)

{
  long *plVar1;
  FileHandle *__s;
  PHYSFS_Io *__dest;
  PHYSFS_Io *pPVar2;
  PHYSFS_Io *retval;
  FileHandle *newfh;
  FileHandle *origfh;
  PHYSFS_Io *io_local;
  
  plVar1 = (long *)io->opaque;
  __s = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
  if (__s == (FileHandle *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
  }
  else {
    memset(__s,0,0x40);
    __dest = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
    if (__dest == (PHYSFS_Io *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    }
    else {
      pPVar2 = (PHYSFS_Io *)(**(code **)(*plVar1 + 0x38))(*plVar1);
      __s->io = pPVar2;
      if (__s->io != (PHYSFS_Io *)0x0) {
        __s->forReading = (PHYSFS_uint8)plVar1[1];
        __s->dirHandle = (DirHandle *)plVar1[2];
        __PHYSFS_platformGrabMutex(stateLock);
        if (__s->forReading == '\0') {
          __s->next = openWriteList;
          openWriteList = __s;
        }
        else {
          __s->next = openReadList;
          openReadList = __s;
        }
        __PHYSFS_platformReleaseMutex(stateLock);
        memcpy(__dest,io,0x50);
        __dest->opaque = __s;
        return __dest;
      }
    }
  }
  if (__s != (FileHandle *)0x0) {
    if (__s->io != (PHYSFS_Io *)0x0) {
      (*__s->io->destroy)(__s->io);
    }
    if (__s->buffer != (PHYSFS_uint8 *)0x0) {
      (*__PHYSFS_AllocatorHooks.Free)(__s->buffer);
    }
    (*__PHYSFS_AllocatorHooks.Free)(__s);
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *handleIo_duplicate(PHYSFS_Io *io)
{
    /*
     * There's no duplicate at the PHYSFS_File level, so we break the
     *  abstraction. We're allowed to: we're physfs.c!
     */
    FileHandle *origfh = (FileHandle *) io->opaque;
    FileHandle *newfh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
    PHYSFS_Io *retval = NULL;

    GOTO_IF(!newfh, PHYSFS_ERR_OUT_OF_MEMORY, handleIo_dupe_failed);
    memset(newfh, '\0', sizeof (*newfh));

    retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, handleIo_dupe_failed);

#if 0  /* we don't buffer the duplicate, at least not at the moment. */
    if (origfh->buffer != NULL)
    {
        newfh->buffer = (PHYSFS_uint8 *) allocator.Malloc(origfh->bufsize);
        if (!newfh->buffer)
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, handleIo_dupe_failed);
        newfh->bufsize = origfh->bufsize;
    } /* if */
#endif

    newfh->io = origfh->io->duplicate(origfh->io);
    GOTO_IF_ERRPASS(!newfh->io, handleIo_dupe_failed);

    newfh->forReading = origfh->forReading;
    newfh->dirHandle = origfh->dirHandle;

    __PHYSFS_platformGrabMutex(stateLock);
    if (newfh->forReading)
    {
        newfh->next = openReadList;
        openReadList = newfh;
    } /* if */
    else
    {
        newfh->next = openWriteList;
        openWriteList = newfh;
    } /* else */
    __PHYSFS_platformReleaseMutex(stateLock);

    memcpy(retval, io, sizeof (PHYSFS_Io));
    retval->opaque = newfh;
    return retval;
    
handleIo_dupe_failed:
    if (newfh)
    {
        if (newfh->io != NULL) newfh->io->destroy(newfh->io);
        if (newfh->buffer != NULL) allocator.Free(newfh->buffer);
        allocator.Free(newfh);
    } /* if */

    return NULL;
}